

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O1

CURLcode singleipconnect(connectdata *conn,Curl_addrinfo *ai,curl_socket_t *sockp)

{
  Curl_easy *data;
  curl_sockopt_callback p_Var1;
  bool bVar2;
  _Bool _Var3;
  CURLcode CVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  if2ip_result_t iVar8;
  size_t sVar9;
  uint *puVar10;
  long lVar11;
  int *piVar12;
  char *pcVar13;
  char *pcVar14;
  ulong uVar15;
  ushort uVar16;
  Curl_easy *pCVar17;
  bool bVar18;
  timeval tVar19;
  curl_socket_t sockfd;
  Curl_dns_entry *h;
  Curl_sockaddr_storage sa;
  long port;
  char ipaddress [46];
  Curl_sockaddr_ex addr;
  char myhost [256];
  socklen_t local_2c4;
  uint local_2c0;
  uint local_2bc;
  Curl_easy *local_2b8;
  char *local_2b0;
  int local_2a4;
  Curl_dns_entry *local_2a0;
  uint local_294;
  undefined4 local_290;
  socklen_t local_28c;
  sockaddr local_288;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  long local_200;
  char local_1f8 [48];
  undefined1 local_1c8 [144];
  sockaddr local_138;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  
  data = conn->data;
  *sockp = -1;
  CVar4 = Curl_socket(conn,ai,(Curl_sockaddr_ex *)local_1c8,(curl_socket_t *)&local_2c0);
  if (CVar4 != CURLE_OK) {
    return CURLE_OK;
  }
  _Var3 = getaddressinfo((sockaddr *)(local_1c8 + 0x10),local_1f8,&local_200);
  if (!_Var3) {
    puVar10 = (uint *)__errno_location();
    uVar7 = *puVar10;
    pcVar13 = Curl_strerror(conn,uVar7);
    Curl_failf(data,"sa_addr inet_ntop() failed with errno %d: %s",(ulong)uVar7,pcVar13);
    Curl_closesocket(conn,local_2c0);
    return CURLE_OK;
  }
  iVar6 = 0;
  Curl_infof(data,"  Trying %s...\n",local_1f8);
  if ((local_1c8._0_4_ == 2) && (local_1c8._4_4_ == 1)) {
    if ((data->set).tcp_nodelay == true) {
      Curl_tcpnodelay(conn,local_2c0);
    }
    uVar7 = local_2c0;
    if ((data->set).tcp_keepalive == true) {
      local_138._0_4_ = 1;
      iVar5 = setsockopt(local_2c0,1,9,&local_138,4);
      if (iVar5 < 0) {
        pcVar13 = "Failed to set SO_KEEPALIVE on fd %d\n";
      }
      else {
        iVar5 = curlx_sltosi((data->set).tcp_keepidle);
        local_138._0_4_ = iVar5;
        iVar5 = setsockopt(uVar7,6,4,&local_138,4);
        if (iVar5 < 0) {
          Curl_infof(data,"Failed to set TCP_KEEPIDLE on fd %d\n",(ulong)uVar7);
        }
        iVar5 = curlx_sltosi((data->set).tcp_keepintvl);
        local_138._0_4_ = iVar5;
        iVar5 = setsockopt(uVar7,6,5,&local_138,4);
        if (-1 < iVar5) goto LAB_004fb5b6;
        pcVar13 = "Failed to set TCP_KEEPINTVL on fd %d\n";
      }
      Curl_infof(data,pcVar13,(ulong)uVar7);
    }
  }
LAB_004fb5b6:
  uVar7 = local_2c0;
  p_Var1 = (data->set).fsockopt;
  if ((p_Var1 == (curl_sockopt_callback)0x0) ||
     (iVar6 = (*p_Var1)((data->set).sockopt_client,local_2c0,CURLSOCKTYPE_IPCXN), iVar6 == 0)) {
    local_290 = 0;
  }
  else {
    local_290 = (undefined4)CONCAT71((uint7)(uint3)((uint)iVar6 >> 8),1);
    if (iVar6 != 2) {
      Curl_closesocket(conn,uVar7);
      return CURLE_ABORTED_BY_CALLBACK;
    }
  }
  local_2a4 = iVar6;
  if (local_1c8._0_4_ != 2) goto LAB_004fba30;
  local_2bc = local_2c0;
  uVar7 = Curl_ipv6_scope((sockaddr *)(local_1c8 + 0x10));
  pCVar17 = conn->data;
  local_2a0 = (Curl_dns_entry *)0x0;
  uVar16 = (pCVar17->set).localport;
  pcVar13 = (pCVar17->set).str[8];
  CVar4 = CURLE_OK;
  if (uVar16 != 0 || pcVar13 != (char *)0x0) {
    iVar6 = (pCVar17->set).localportrange;
    local_218 = 0;
    uStack_210 = 0;
    local_228 = 0;
    uStack_220 = 0;
    local_238 = 0;
    uStack_230 = 0;
    local_248 = 0;
    uStack_240 = 0;
    local_258 = 0;
    uStack_250 = 0;
    local_268 = 0;
    uStack_260 = 0;
    local_278 = 0;
    uStack_270 = 0;
    local_288.sa_family = 0;
    local_288.sa_data[0] = '\0';
    local_288.sa_data[1] = '\0';
    local_288.sa_data[2] = '\0';
    local_288.sa_data[3] = '\0';
    local_288.sa_data[4] = '\0';
    local_288.sa_data[5] = '\0';
    local_288.sa_data[6] = '\0';
    local_288.sa_data[7] = '\0';
    local_288.sa_data[8] = '\0';
    local_288.sa_data[9] = '\0';
    local_288.sa_data[10] = '\0';
    local_288.sa_data[0xb] = '\0';
    local_288.sa_data[0xc] = '\0';
    local_288.sa_data[0xd] = '\0';
    local_2b8 = pCVar17;
    if ((pcVar13 == (char *)0x0) || (sVar9 = strlen(pcVar13), 0xfe < sVar9)) {
      local_288.sa_data._0_2_ = uVar16 << 8 | uVar16 >> 8;
      local_288.sa_family = 2;
      local_2c4 = 0x10;
    }
    else {
      memset(&local_138,0,0x100);
      pcVar14 = pcVar13;
      iVar5 = strncmp("if!",pcVar13,3);
      if (iVar5 == 0) {
        uVar15 = CONCAT71((int7)((ulong)pcVar14 >> 8),1);
        bVar18 = false;
        lVar11 = 3;
      }
      else {
        iVar5 = strncmp("host!",pcVar13,5);
        bVar18 = iVar5 == 0;
        lVar11 = (ulong)bVar18 * 5;
        uVar15 = 0;
      }
      pcVar13 = pcVar13 + lVar11;
      local_2b0 = pcVar13;
      if (bVar18) {
        CVar4 = CURLE_OK;
LAB_004fb874:
        if ((char)uVar15 == '\0') {
          lVar11 = conn->ip_version;
          conn->ip_version = 1;
          Curl_resolv(conn,pcVar13,0,&local_2a0);
          conn->ip_version = lVar11;
          if (local_2a0 == (Curl_dns_entry *)0x0) {
            CVar4 = ~CURLE_OK;
            pcVar13 = local_2b0;
          }
          else {
            Curl_printable_address(local_2a0->addr,(char *)&local_138,0x100);
            pCVar17 = local_2b8;
            Curl_infof(local_2b8,"Name \'%s\' family %i resolved to \'%s\' family %i\n",local_2b0,2,
                       &local_138,(ulong)(uint)local_2a0->addr->ai_family);
            Curl_resolv_unlock(pCVar17,local_2a0);
            CVar4 = CURLE_UNSUPPORTED_PROTOCOL;
            pcVar13 = local_2b0;
          }
        }
        local_2c4 = 0;
        if (0 < (int)CVar4) {
          iVar5 = inet_pton(2,(char *)&local_138,local_288.sa_data + 2);
          local_2c4 = 0;
          pcVar13 = local_2b0;
          if (0 < iVar5) {
            local_288.sa_data._0_2_ = uVar16 << 8 | uVar16 >> 8;
            local_288.sa_family = 2;
            local_2c4 = 0x10;
          }
        }
        if ((int)CVar4 < 1) {
          pcVar14 = "Couldn\'t bind to \'%s\'";
LAB_004fb9e8:
          Curl_failf(local_2b8,pcVar14,pcVar13);
          bVar18 = false;
          CVar4 = CURLE_INTERFACE_FAILED;
        }
        else {
          bVar18 = true;
        }
      }
      else {
        local_294 = (uint)uVar15;
        iVar8 = Curl_if2ip(2,uVar7,conn->scope_id,pcVar13,(char *)&local_138,0x100);
        pcVar13 = local_2b0;
        if (iVar8 == IF2IP_FOUND) {
          Curl_infof(local_2b8,"Local Interface %s is ip %s using address family %i\n",local_2b0,
                     &local_138,2);
          sVar9 = strlen(pcVar13);
          iVar5 = setsockopt(local_2bc,1,0x19,pcVar13,(int)sVar9 + 1);
          if (iVar5 != 0) {
            puVar10 = (uint *)__errno_location();
            uVar7 = *puVar10;
            pcVar14 = Curl_strerror(conn,uVar7);
            Curl_infof(local_2b8,
                       "SO_BINDTODEVICE %s failed with errno %d: %s; will do regular bind\n",pcVar13
                       ,(ulong)uVar7,pcVar14);
          }
          uVar15 = 1;
          CVar4 = CURLE_UNSUPPORTED_PROTOCOL;
          goto LAB_004fb874;
        }
        CVar4 = CURLE_OK;
        local_2c4 = 0;
        uVar15 = (ulong)local_294;
        if (iVar8 != IF2IP_AF_NOT_SUPPORTED) {
          if ((iVar8 != IF2IP_NOT_FOUND) || (CVar4 = CURLE_OK, (char)local_294 == '\0'))
          goto LAB_004fb874;
          local_2c4 = 0;
          pcVar14 = "Couldn\'t bind to interface \'%s\'";
          goto LAB_004fb9e8;
        }
        bVar18 = false;
        CVar4 = CURLE_UNSUPPORTED_PROTOCOL;
      }
      if (!bVar18) goto LAB_004fba0f;
    }
    iVar5 = bind(local_2bc,&local_288,local_2c4);
    while (iVar5 < 0) {
      if (iVar6 < 2) {
        puVar10 = (uint *)__errno_location();
        pCVar17 = local_2b8;
        uVar7 = *puVar10;
        (local_2b8->state).os_errno = uVar7;
        pcVar13 = Curl_strerror(conn,uVar7);
        pcVar14 = "bind failed with errno %d: %s";
        goto LAB_004fb83b;
      }
      Curl_infof(local_2b8,"Bind to local port %hu failed, trying next\n",(ulong)uVar16);
      uVar16 = uVar16 + 1;
      if (local_288.sa_family == 2) {
        local_288.sa_data._0_2_ = uVar16 * 0x100 | uVar16 >> 8;
        local_288.sa_family = 2;
      }
      iVar5 = bind(local_2bc,&local_288,local_2c4);
      iVar6 = iVar6 + -1;
    }
    local_28c = 0x80;
    local_138.sa_family = 0;
    local_138.sa_data[0] = '\0';
    local_138.sa_data[1] = '\0';
    local_138.sa_data[2] = '\0';
    local_138.sa_data[3] = '\0';
    local_138.sa_data[4] = '\0';
    local_138.sa_data[5] = '\0';
    local_138.sa_data[6] = '\0';
    local_138.sa_data[7] = '\0';
    local_138.sa_data[8] = '\0';
    local_138.sa_data[9] = '\0';
    local_138.sa_data[10] = '\0';
    local_138.sa_data[0xb] = '\0';
    local_138.sa_data[0xc] = '\0';
    local_138.sa_data[0xd] = '\0';
    local_128 = 0;
    uStack_120 = 0;
    local_118 = 0;
    uStack_110 = 0;
    local_108 = 0;
    uStack_100 = 0;
    local_f8 = 0;
    uStack_f0 = 0;
    local_e8 = 0;
    uStack_e0 = 0;
    local_d8 = 0;
    uStack_d0 = 0;
    local_c8 = 0;
    uStack_c0 = 0;
    iVar6 = getsockname(local_2bc,&local_138,&local_28c);
    if (iVar6 < 0) {
      puVar10 = (uint *)__errno_location();
      pCVar17 = local_2b8;
      uVar7 = *puVar10;
      (local_2b8->state).os_errno = uVar7;
      pcVar13 = Curl_strerror(conn,uVar7);
      pcVar14 = "getsockname() failed with errno %d: %s";
LAB_004fb83b:
      Curl_failf(pCVar17,pcVar14,(ulong)uVar7,pcVar13);
      CVar4 = CURLE_INTERFACE_FAILED;
    }
    else {
      CVar4 = CURLE_OK;
      Curl_infof(local_2b8,"Local port: %hu\n",(ulong)uVar16);
      (conn->bits).bound = true;
    }
  }
LAB_004fba0f:
  if (CVar4 != CURLE_OK) {
    Curl_closesocket(conn,local_2bc);
    if (CVar4 == CURLE_UNSUPPORTED_PROTOCOL) {
      return CURLE_COULDNT_CONNECT;
    }
    return CVar4;
  }
LAB_004fba30:
  curlx_nonblock(local_2c0,1);
  tVar19 = curlx_tvnow();
  conn->connecttime = tVar19;
  if (1 < conn->num_addr) {
    Curl_expire(data,conn->timeoutms_per_addr,EXPIRE_DNS_PER_NAME);
  }
  if (((char)local_290 == '\0') && (conn->socktype == 1)) {
    if (((conn->bits).tcp_fastopen == true) && ((conn->given->flags & 1) == 0)) {
      bVar18 = false;
    }
    else {
      iVar6 = connect(local_2c0,(sockaddr *)(local_1c8 + 0x10),local_1c8._12_4_);
      bVar18 = iVar6 == -1;
    }
    if (bVar18) {
      piVar12 = __errno_location();
      local_2a4 = *piVar12;
    }
    iVar6 = local_2a4;
    bVar2 = true;
    CVar4 = CURLE_OK;
    if (((bVar18) && (CVar4 = CURLE_OK, local_2a4 != 0xb)) && (local_2a4 != 0x73)) {
      pcVar13 = Curl_strerror(conn,local_2a4);
      Curl_infof(data,"Immediate connect fail for %s: %s\n",local_1f8,pcVar13);
      (data->state).os_errno = iVar6;
      Curl_closesocket(conn,local_2c0);
      bVar2 = false;
      CVar4 = CURLE_COULDNT_CONNECT;
    }
    if (bVar2) {
      *sockp = local_2c0;
    }
  }
  else {
    *sockp = local_2c0;
    CVar4 = CURLE_OK;
  }
  return CVar4;
}

Assistant:

static CURLcode singleipconnect(struct connectdata *conn,
                                const Curl_addrinfo *ai,
                                curl_socket_t *sockp)
{
  struct Curl_sockaddr_ex addr;
  int rc = -1;
  int error = 0;
  bool isconnected = FALSE;
  struct Curl_easy *data = conn->data;
  curl_socket_t sockfd;
  CURLcode result;
  char ipaddress[MAX_IPADR_LEN];
  long port;
  bool is_tcp;

  *sockp = CURL_SOCKET_BAD;

  result = Curl_socket(conn, ai, &addr, &sockfd);
  if(result)
    /* Failed to create the socket, but still return OK since we signal the
       lack of socket as well. This allows the parent function to keep looping
       over alternative addresses/socket families etc. */
    return CURLE_OK;

  /* store remote address and port used in this connection attempt */
  if(!getaddressinfo((struct sockaddr*)&addr.sa_addr,
                     ipaddress, &port)) {
    /* malformed address or bug in inet_ntop, try next address */
    error = ERRNO;
    failf(data, "sa_addr inet_ntop() failed with errno %d: %s",
          error, Curl_strerror(conn, error));
    Curl_closesocket(conn, sockfd);
    return CURLE_OK;
  }
  infof(data, "  Trying %s...\n", ipaddress);

#ifdef ENABLE_IPV6
  is_tcp = (addr.family == AF_INET || addr.family == AF_INET6) &&
    addr.socktype == SOCK_STREAM;
#else
  is_tcp = (addr.family == AF_INET) && addr.socktype == SOCK_STREAM;
#endif
  if(is_tcp && data->set.tcp_nodelay)
    Curl_tcpnodelay(conn, sockfd);

  nosigpipe(conn, sockfd);

  Curl_sndbufset(sockfd);

  if(is_tcp && data->set.tcp_keepalive)
    tcpkeepalive(data, sockfd);

  if(data->set.fsockopt) {
    /* activate callback for setting socket options */
    error = data->set.fsockopt(data->set.sockopt_client,
                               sockfd,
                               CURLSOCKTYPE_IPCXN);

    if(error == CURL_SOCKOPT_ALREADY_CONNECTED)
      isconnected = TRUE;
    else if(error) {
      Curl_closesocket(conn, sockfd); /* close the socket and bail out */
      return CURLE_ABORTED_BY_CALLBACK;
    }
  }

  /* possibly bind the local end to an IP, interface or port */
  if(addr.family == AF_INET
#ifdef ENABLE_IPV6
     || addr.family == AF_INET6
#endif
    ) {
    result = bindlocal(conn, sockfd, addr.family,
                       Curl_ipv6_scope((struct sockaddr*)&addr.sa_addr));
    if(result) {
      Curl_closesocket(conn, sockfd); /* close socket and bail out */
      if(result == CURLE_UNSUPPORTED_PROTOCOL) {
        /* The address family is not supported on this interface.
           We can continue trying addresses */
        return CURLE_COULDNT_CONNECT;
      }
      return result;
    }
  }

  /* set socket non-blocking */
  (void)curlx_nonblock(sockfd, TRUE);

  conn->connecttime = Curl_tvnow();
  if(conn->num_addr > 1)
    Curl_expire(data, conn->timeoutms_per_addr, EXPIRE_DNS_PER_NAME);

  /* Connect TCP sockets, bind UDP */
  if(!isconnected && (conn->socktype == SOCK_STREAM)) {
    if(conn->bits.tcp_fastopen) {
#if defined(CONNECT_DATA_IDEMPOTENT) /* OS X */
      sa_endpoints_t endpoints;
      endpoints.sae_srcif = 0;
      endpoints.sae_srcaddr = NULL;
      endpoints.sae_srcaddrlen = 0;
      endpoints.sae_dstaddr = &addr.sa_addr;
      endpoints.sae_dstaddrlen = addr.addrlen;

      rc = connectx(sockfd, &endpoints, SAE_ASSOCID_ANY,
                    CONNECT_RESUME_ON_READ_WRITE | CONNECT_DATA_IDEMPOTENT,
                    NULL, 0, NULL, NULL);
#elif defined(MSG_FASTOPEN) /* Linux */
      if(conn->given->flags & PROTOPT_SSL)
        rc = connect(sockfd, &addr.sa_addr, addr.addrlen);
      else
        rc = 0; /* Do nothing */
#endif
    }
    else {
      rc = connect(sockfd, &addr.sa_addr, addr.addrlen);
    }

    if(-1 == rc)
      error = SOCKERRNO;
  }
  else {
    *sockp = sockfd;
    return CURLE_OK;
  }

#ifdef ENABLE_IPV6
  conn->bits.ipv6 = (addr.family == AF_INET6)?TRUE:FALSE;
#endif

  if(-1 == rc) {
    switch(error) {
    case EINPROGRESS:
    case EWOULDBLOCK:
#if defined(EAGAIN)
#if (EAGAIN) != (EWOULDBLOCK)
      /* On some platforms EAGAIN and EWOULDBLOCK are the
       * same value, and on others they are different, hence
       * the odd #if
       */
    case EAGAIN:
#endif
#endif
      result = CURLE_OK;
      break;

    default:
      /* unknown error, fallthrough and try another address! */
      infof(data, "Immediate connect fail for %s: %s\n",
            ipaddress, Curl_strerror(conn, error));
      data->state.os_errno = error;

      /* connect failed */
      Curl_closesocket(conn, sockfd);
      result = CURLE_COULDNT_CONNECT;
    }
  }

  if(!result)
    *sockp = sockfd;

  return result;
}